

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_slider_behavior(nk_flags *state,nk_rect *logical_cursor,nk_rect *visual_cursor,nk_input *in
                        ,nk_rect bounds,float slider_min,float slider_max,float slider_value,
                        float slider_step,float slider_steps)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  float fVar4;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float steps;
  float pxstep;
  float d;
  float ratio;
  int left_mouse_click_in_cursor;
  int left_mouse_down;
  float slider_steps_local;
  float slider_step_local;
  float slider_value_local;
  float slider_max_local;
  float slider_min_local;
  nk_input *in_local;
  nk_rect *visual_cursor_local;
  nk_rect *logical_cursor_local;
  nk_flags *state_local;
  nk_rect bounds_local;
  
  state_local._0_4_ = bounds.x;
  bounds_local.x = bounds.w;
  if ((*state & 2) == 0) {
    *state = 4;
  }
  else {
    *state = 6;
  }
  bVar2 = false;
  if (in != (nk_input *)0x0) {
    bVar2 = (in->mouse).buttons[0].down != 0;
  }
  bVar3 = false;
  if (in != (nk_input *)0x0) {
    iVar1 = nk_input_has_mouse_click_down_in_rect(in,NK_BUTTON_LEFT,*visual_cursor,1);
    bVar3 = iVar1 != 0;
  }
  slider_steps_local = slider_value;
  if ((bVar2) && (bVar3)) {
    fVar4 = (in->mouse).pos.x - (visual_cursor->w * 0.5 + visual_cursor->x);
    *state = 0x22;
    local_6c = fVar4;
    if (fVar4 < 0.0) {
      local_6c = -fVar4;
    }
    if (bounds_local.x / slider_steps <= local_6c) {
      local_70 = fVar4;
      if (fVar4 < 0.0) {
        local_70 = -fVar4;
      }
      local_74 = (float)(int)(local_70 / (bounds_local.x / slider_steps));
      if (fVar4 <= 0.0) {
        local_74 = -(slider_step * local_74);
      }
      else {
        local_74 = slider_step * local_74;
      }
      local_74 = local_74 + slider_value;
      local_78 = slider_max;
      if (local_74 < slider_max) {
        local_78 = local_74;
      }
      local_7c = slider_min;
      if (slider_min <= local_78) {
        local_80 = slider_max;
        if (local_74 < slider_max) {
          local_80 = local_74;
        }
        local_7c = local_80;
      }
      slider_steps_local = local_7c;
      logical_cursor->x =
           logical_cursor->w * ((local_7c - slider_min) / slider_step) + state_local._0_4_;
      (in->mouse).buttons[0].clicked_pos.x = logical_cursor->x;
    }
  }
  iVar1 = nk_input_is_mouse_hovering_rect(in,bounds);
  if (iVar1 != 0) {
    *state = 0x12;
  }
  if (((*state & 0x10) == 0) ||
     (iVar1 = nk_input_is_mouse_prev_hovering_rect(in,bounds), iVar1 != 0)) {
    iVar1 = nk_input_is_mouse_prev_hovering_rect(in,bounds);
    if (iVar1 != 0) {
      *state = *state | 0x40;
    }
  }
  else {
    *state = *state | 8;
  }
  return slider_steps_local;
}

Assistant:

NK_LIB float
nk_slider_behavior(nk_flags *state, struct nk_rect *logical_cursor,
    struct nk_rect *visual_cursor, struct nk_input *in,
    struct nk_rect bounds, float slider_min, float slider_max, float slider_value,
    float slider_step, float slider_steps)
{
    int left_mouse_down;
    int left_mouse_click_in_cursor;

    /* check if visual cursor is being dragged */
    nk_widget_state_reset(state);
    left_mouse_down = in && in->mouse.buttons[NK_BUTTON_LEFT].down;
    left_mouse_click_in_cursor = in && nk_input_has_mouse_click_down_in_rect(in,
            NK_BUTTON_LEFT, *visual_cursor, nk_true);

    if (left_mouse_down && left_mouse_click_in_cursor) {
        float ratio = 0;
        const float d = in->mouse.pos.x - (visual_cursor->x+visual_cursor->w*0.5f);
        const float pxstep = bounds.w / slider_steps;

        /* only update value if the next slider step is reached */
        *state = NK_WIDGET_STATE_ACTIVE;
        if (NK_ABS(d) >= pxstep) {
            const float steps = (float)((int)(NK_ABS(d) / pxstep));
            slider_value += (d > 0) ? (slider_step*steps) : -(slider_step*steps);
            slider_value = NK_CLAMP(slider_min, slider_value, slider_max);
            ratio = (slider_value - slider_min)/slider_step;
            logical_cursor->x = bounds.x + (logical_cursor->w * ratio);
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x = logical_cursor->x;
        }
    }

    /* slider widget state */
    if (nk_input_is_mouse_hovering_rect(in, bounds))
        *state = NK_WIDGET_STATE_HOVERED;
    if (*state & NK_WIDGET_STATE_HOVER &&
        !nk_input_is_mouse_prev_hovering_rect(in, bounds))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(in, bounds))
        *state |= NK_WIDGET_STATE_LEFT;
    return slider_value;
}